

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this)

{
  ELLIPSOID *this_local;
  
  this->a = 6378137.0;
  this->b = 6356752.3142;
  this->c = (this->a * this->a) / this->b;
  this->alpha = (this->a - this->b) / this->a;
  this->e2 = (this->a * this->a + -(this->b * this->b)) / (this->a * this->a);
  this->e1_2 = (this->a * this->a + -(this->b * this->b)) / (this->b * this->b);
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID()
{
    this->a = a_w;
    this->b = b_w;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
}